

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidateAttributeValue2
              (xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlChar *name,xmlAttributeType type,xmlChar *value
              )

{
  byte bVar1;
  xmlHashTablePtr pxVar2;
  xmlEntityPtr pxVar3;
  byte *pbVar4;
  void *pvVar5;
  char *pcVar6;
  xmlParserErrors xVar7;
  byte *name_00;
  byte *pbVar8;
  int local_4c;
  
  if (type == XML_ATTRIBUTE_NOTATION) {
    if (((doc->intSubset != (_xmlDtd *)0x0) &&
        (pxVar2 = (xmlHashTablePtr)doc->intSubset->notations, pxVar2 != (xmlHashTablePtr)0x0)) &&
       (pvVar5 = xmlHashLookup(pxVar2,value), pvVar5 != (void *)0x0)) {
      return 1;
    }
    if (((doc->extSubset != (_xmlDtd *)0x0) &&
        (pxVar2 = (xmlHashTablePtr)doc->extSubset->notations, pxVar2 != (xmlHashTablePtr)0x0)) &&
       (pvVar5 = xmlHashLookup(pxVar2,value), pvVar5 != (void *)0x0)) {
      return 1;
    }
    pcVar6 = "NOTATION attribute %s reference an unknown notation \"%s\"\n";
    xVar7 = XML_DTD_UNKNOWN_NOTATION;
  }
  else {
    if (type == XML_ATTRIBUTE_ENTITIES) {
      pbVar4 = xmlStrdup(value);
      if (pbVar4 == (byte *)0x0) {
        return 0;
      }
      if (*pbVar4 == 0) {
        local_4c = 1;
      }
      else {
        local_4c = 1;
        pbVar8 = pbVar4;
        name_00 = pbVar4;
        do {
          while( true ) {
            bVar1 = *pbVar8;
            if (((ulong)bVar1 < 0x21) && ((0x100002601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
            pbVar8 = pbVar8 + 1;
          }
          *pbVar8 = 0;
          pxVar3 = xmlGetDocEntity(doc,name_00);
          if (pxVar3 == (xmlEntityPtr)0x0) {
            xVar7 = XML_DTD_UNKNOWN_ENTITY;
            pcVar6 = "ENTITIES attribute %s reference an unknown entity \"%s\"\n";
LAB_00197485:
            xmlErrValidNode(ctxt,(xmlNodePtr)doc,xVar7,pcVar6,name,name_00,(xmlChar *)0x0);
            local_4c = 0;
          }
          else if (pxVar3->etype != XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
            xVar7 = XML_DTD_ENTITY_TYPE;
            pcVar6 = "ENTITIES attribute %s reference an entity \"%s\" of wrong type\n";
            goto LAB_00197485;
          }
          if (bVar1 == 0) break;
          *pbVar8 = bVar1;
          while (((ulong)*pbVar8 < 0x21 && ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0))) {
            pbVar8 = pbVar8 + 1;
          }
          name_00 = pbVar8;
        } while (*pbVar8 != 0);
      }
      (*xmlFree)(pbVar4);
      return local_4c;
    }
    if (type != XML_ATTRIBUTE_ENTITY) {
      return 1;
    }
    pxVar3 = xmlGetDocEntity(doc,value);
    if (pxVar3 == (xmlEntityPtr)0x0) {
      if (doc->standalone == 1) {
        doc->standalone = 0;
        pxVar3 = xmlGetDocEntity(doc,value);
      }
      else {
        pxVar3 = (xmlEntityPtr)0x0;
      }
    }
    if (pxVar3 == (xmlEntityPtr)0x0) {
      pcVar6 = "ENTITY attribute %s reference an unknown entity \"%s\"\n";
      xVar7 = XML_DTD_UNKNOWN_ENTITY;
    }
    else {
      if (pxVar3->etype == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
        return 1;
      }
      pcVar6 = "ENTITY attribute %s reference an entity \"%s\" of wrong type\n";
      xVar7 = XML_DTD_ENTITY_TYPE;
    }
  }
  xmlErrValidNode(ctxt,(xmlNodePtr)doc,xVar7,pcVar6,name,value,(xmlChar *)0x0);
  return 0;
}

Assistant:

static int
xmlValidateAttributeValue2(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
      const xmlChar *name, xmlAttributeType type, const xmlChar *value) {
    int ret = 1;
    switch (type) {
	case XML_ATTRIBUTE_IDREFS:
	case XML_ATTRIBUTE_IDREF:
	case XML_ATTRIBUTE_ID:
	case XML_ATTRIBUTE_NMTOKENS:
	case XML_ATTRIBUTE_ENUMERATION:
	case XML_ATTRIBUTE_NMTOKEN:
        case XML_ATTRIBUTE_CDATA:
	    break;
	case XML_ATTRIBUTE_ENTITY: {
	    xmlEntityPtr ent;

	    ent = xmlGetDocEntity(doc, value);
	    /* yeah it's a bit messy... */
	    if ((ent == NULL) && (doc->standalone == 1)) {
		doc->standalone = 0;
		ent = xmlGetDocEntity(doc, value);
	    }
	    if (ent == NULL) {
		xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				XML_DTD_UNKNOWN_ENTITY,
   "ENTITY attribute %s reference an unknown entity \"%s\"\n",
		       name, value, NULL);
		ret = 0;
	    } else if (ent->etype != XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
		xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				XML_DTD_ENTITY_TYPE,
   "ENTITY attribute %s reference an entity \"%s\" of wrong type\n",
		       name, value, NULL);
		ret = 0;
	    }
	    break;
        }
	case XML_ATTRIBUTE_ENTITIES: {
	    xmlChar *dup, *nam = NULL, *cur, save;
	    xmlEntityPtr ent;

	    dup = xmlStrdup(value);
	    if (dup == NULL)
		return(0);
	    cur = dup;
	    while (*cur != 0) {
		nam = cur;
		while ((*cur != 0) && (!IS_BLANK_CH(*cur))) cur++;
		save = *cur;
		*cur = 0;
		ent = xmlGetDocEntity(doc, nam);
		if (ent == NULL) {
		    xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				    XML_DTD_UNKNOWN_ENTITY,
       "ENTITIES attribute %s reference an unknown entity \"%s\"\n",
			   name, nam, NULL);
		    ret = 0;
		} else if (ent->etype != XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
		    xmlErrValidNode(ctxt, (xmlNodePtr) doc,
				    XML_DTD_ENTITY_TYPE,
       "ENTITIES attribute %s reference an entity \"%s\" of wrong type\n",
			   name, nam, NULL);
		    ret = 0;
		}
		if (save == 0)
		    break;
		*cur = save;
		while (IS_BLANK_CH(*cur)) cur++;
	    }
	    xmlFree(dup);
	    break;
	}
	case XML_ATTRIBUTE_NOTATION: {
	    xmlNotationPtr nota;

	    nota = xmlGetDtdNotationDesc(doc->intSubset, value);
	    if ((nota == NULL) && (doc->extSubset != NULL))
		nota = xmlGetDtdNotationDesc(doc->extSubset, value);

	    if (nota == NULL) {
		xmlErrValidNode(ctxt, (xmlNodePtr) doc,
		                XML_DTD_UNKNOWN_NOTATION,
       "NOTATION attribute %s reference an unknown notation \"%s\"\n",
		       name, value, NULL);
		ret = 0;
	    }
	    break;
        }
    }
    return(ret);
}